

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos)

{
  int local_34;
  size_t sStack_30;
  int flags;
  size_t consumed;
  CURLcode result;
  _Bool is_eos_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  consumed._7_1_ = is_eos;
  _result = blen;
  blen_local = (size_t)buf;
  buf_local = (char *)data;
  consumed._0_4_ = Curl_http_write_resp_hds(data,buf,blen,&stack0xffffffffffffffd0);
  if (((CURLcode)consumed == CURLE_OK) && ((*(uint *)(buf_local + 0x1c9) >> 1 & 1) == 0)) {
    _result = _result - sStack_30;
    blen_local = sStack_30 + blen_local;
    if (((*(uint *)(buf_local + 0x1c9) & 1) == 0) && ((_result != 0 || ((consumed._7_1_ & 1) != 0)))
       ) {
      local_34 = 1;
      if ((consumed._7_1_ & 1) != 0) {
        local_34 = 0x81;
      }
      consumed._0_4_ = Curl_client_write((Curl_easy *)buf_local,local_34,(char *)blen_local,_result)
      ;
    }
  }
  return (CURLcode)consumed;
}

Assistant:

CURLcode Curl_http_write_resp(struct Curl_easy *data,
                              const char *buf, size_t blen,
                              bool is_eos)
{
  CURLcode result;
  size_t consumed;
  int flags;

  result = Curl_http_write_resp_hds(data, buf, blen, &consumed);
  if(result || data->req.done)
    goto out;

  DEBUGASSERT(consumed <= blen);
  blen -= consumed;
  buf += consumed;
  /* either all was consumed in header parsing, or we have data left
   * and are done with headers, e.g. it is BODY data */
  DEBUGASSERT(!blen || !data->req.header);
  if(!data->req.header && (blen || is_eos)) {
    /* BODY data after header been parsed, write and consume */
    flags = CLIENTWRITE_BODY;
    if(is_eos)
      flags |= CLIENTWRITE_EOS;
    result = Curl_client_write(data, flags, (char *)buf, blen);
  }
out:
  return result;
}